

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::DisposeObjects(LargeHeapBlock *this,Recycler *recycler)

{
  size_t *psVar1;
  HeapInfo *pHVar2;
  code *pcVar3;
  bool bVar4;
  uchar uVar5;
  undefined4 *puVar6;
  LargeObjectHeader *pLVar7;
  LargeObjectHeader *this_00;
  
  if ((this->pendingDisposeObject == (LargeObjectHeader *)0x0) &&
     (this->hasDisposeBeenCalled == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x806,
                       "(this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled)",
                       "this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled");
    if (!bVar4) {
LAB_006f3bf2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  this_00 = this->pendingDisposeObject;
  if (this_00 != (LargeObjectHeader *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      this->hasDisposeBeenCalled = true;
      pLVar7 = LargeObjectHeader::GetNext(this_00,this->heapInfo->recycler->Cookie);
      this->pendingDisposeObject = pLVar7;
      uVar5 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
      if (-1 < (char)uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x810,
                           "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)"
                           ,"header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit")
        ;
        if (!bVar4) goto LAB_006f3bf2;
        *puVar6 = 0;
      }
      if ((&this[1].super_HeapBlock._vptr_HeapBlock)[this_00->objectIndex] != (_func_int **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x811,"(this->HeaderList()[header->objectIndex] == nullptr)",
                           "this->HeaderList()[header->objectIndex] == nullptr");
        if (!bVar4) goto LAB_006f3bf2;
        *puVar6 = 0;
      }
      (**(code **)(*(long *)(this_00 + 1) + 8))(this_00 + 1,0);
      if (this->finalizeCount == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x816,"(finalizeCount != 0)","finalizeCount != 0");
        if (!bVar4) goto LAB_006f3bf2;
        *puVar6 = 0;
      }
      this->finalizeCount = this->finalizeCount - 1;
      if (this->bucket->supportFreeList == true) {
        bVar4 = TrimObject(this,recycler,this_00,this_00->objectSize,true);
        if (!bVar4) goto LAB_006f3ba6;
      }
      else {
LAB_006f3ba6:
        FillFreeMemory(this,recycler,this_00,this_00->objectSize + 0x20);
      }
      psVar1 = &(recycler->collectionStats).finalizeSweepCount;
      *psVar1 = *psVar1 + 1;
      pHVar2 = this->heapInfo;
      psVar1 = &pHVar2->liveFinalizableObjectCount;
      *psVar1 = *psVar1 - 1;
      psVar1 = &pHVar2->pendingDisposableObjectCount;
      *psVar1 = *psVar1 - 1;
      this_00 = this->pendingDisposeObject;
    } while (this_00 != (LargeObjectHeader *)0x0);
  }
  return;
}

Assistant:

void
LargeHeapBlock::DisposeObjects(Recycler * recycler)
{
    Assert(this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled);

    while (pendingDisposeObject != nullptr)
    {
#if DBG
        this->hasDisposeBeenCalled = true;
#endif

        LargeObjectHeader * header = pendingDisposeObject;
        pendingDisposeObject = header->GetNext(this->heapInfo->recycler->Cookie);
        Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);
        Assert(this->HeaderList()[header->objectIndex] == nullptr);

        void * objectAddress = header->GetAddress();
        ((FinalizableObject *)objectAddress)->Dispose(false);

        Assert(finalizeCount != 0);
        finalizeCount--;

        bool objectTrimmed = false;

        if (this->bucket->SupportFreeList())
        {
            objectTrimmed = TrimObject(recycler, header, header->objectSize, true /* need suspend */);
        }

        // GCTODO: Consider free listing items after Dispose too
        // GCTODO: Consider compacting heap blocks- if the last n items are free, move the address pointer
        // back to before the nth item so we can bump allocate from this heap block
        if (!objectTrimmed)
        {
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + header->objectSize);
        }

        RECYCLER_STATS_INC(recycler, finalizeSweepCount);
#ifdef RECYCLER_FINALIZE_CHECK
        this->heapInfo->liveFinalizableObjectCount--;
        this->heapInfo->pendingDisposableObjectCount--;
#endif
    }
}